

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

string * __thiscall
QUtil::read_file_into_string_abi_cxx11_
          (string *__return_storage_ptr__,QUtil *this,FILE *f,string_view filename)

{
  int iVar1;
  int iVar2;
  QUtil *this_00;
  QUtil *this_01;
  runtime_error *prVar3;
  QUtil *pQVar4;
  size_t sVar5;
  allocator<char> local_16a;
  allocator<char> local_169;
  string buffer;
  string_view filename_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  qpdf_offset_t o_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  filename_local._M_str = (char *)filename._M_len;
  filename_local._M_len = (size_t)f;
  fseek((FILE *)this,0,2);
  o_size = ftello((FILE *)this);
  if (o_size < 0) {
    buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
    sVar5 = 0x2000;
    std::__cxx11::string::_M_construct((ulong)&buffer,'\0');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    while (sVar5 == 0x2000) {
      sVar5 = fread(buffer._M_dataplus._M_p,1,0x2000,(FILE *)this);
      std::__cxx11::string::erase((ulong)&buffer,sVar5);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    iVar2 = ferror((FILE *)this);
    if (iVar2 != 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"failure reading file ",(allocator<char> *)&local_90);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_138,&filename_local,(allocator<char> *)&local_b0);
      std::operator+(&local_f8,&local_118,&local_138);
      std::operator+(&local_d8,&local_f8," into memory");
      std::runtime_error::runtime_error(prVar3,(string *)&local_d8);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::~string((string *)&buffer);
  }
  else {
    this_00 = (QUtil *)QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert(&o_size);
    fseek((FILE *)this,0,0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)this_00);
    pQVar4 = this;
    this_01 = (QUtil *)fread((__return_storage_ptr__->_M_dataplus)._M_p,1,(size_t)this_00,
                             (FILE *)this);
    iVar2 = (int)pQVar4;
    if (this_01 != this_00) {
      iVar1 = ferror((FILE *)this);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      if (iVar1 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"premature eof reading file ",&local_169);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_b0,&filename_local,&local_16a);
        std::operator+(&local_138,&local_90,&local_b0);
        std::operator+(&local_118,&local_138," into memory: read ");
        uint_to_string_abi_cxx11_(&local_50,this_01,0,iVar2);
        std::operator+(&local_f8,&local_118,&local_50);
        std::operator+(&local_d8,&local_f8,"; wanted ");
        uint_to_string_abi_cxx11_(&local_70,this_00,0,iVar2);
        std::operator+(&buffer,&local_d8,&local_70);
        std::runtime_error::runtime_error(prVar3,(string *)&buffer);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"failure reading file ",&local_169);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_b0,&filename_local,&local_16a);
      std::operator+(&local_138,&local_90,&local_b0);
      std::operator+(&local_118,&local_138," into memory: read ");
      uint_to_string_abi_cxx11_(&local_50,this_01,0,iVar2);
      std::operator+(&local_f8,&local_118,&local_50);
      std::operator+(&local_d8,&local_f8,"; wanted ");
      uint_to_string_abi_cxx11_(&local_70,this_00,0,iVar2);
      std::operator+(&buffer,&local_d8,&local_70);
      std::runtime_error::runtime_error(prVar3,(string *)&buffer);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::read_file_into_string(FILE* f, std::string_view filename)
{
    fseek(f, 0, SEEK_END);
    auto o_size = QUtil::tell(f);
    if (o_size >= 0) {
        // Seekable file
        auto size = QIntC::to_size(o_size);
        fseek(f, 0, SEEK_SET);
        std::string result(size, '\0');
        if (auto n_read = fread(result.data(), 1, size, f); n_read != size) {
            if (ferror(f)) {
                throw std::runtime_error(
                    std::string("failure reading file ") + std::string(filename) +
                    " into memory: read " + uint_to_string(n_read) + "; wanted " +
                    uint_to_string(size));
            } else {
                throw std::runtime_error(
                    std::string("premature eof reading file ") + std::string(filename) +
                    " into memory: read " + uint_to_string(n_read) + "; wanted " +
                    uint_to_string(size));
            }
        }
        return result;
    } else {
        // Pipe or other non-seekable file
        size_t buf_size = 8192;
        auto n_read = buf_size;
        std::string buffer(buf_size, '\0');
        std::string result;
        while (n_read == buf_size) {
            n_read = fread(buffer.data(), 1, buf_size, f);
            buffer.erase(n_read);
            result.append(buffer);
        }
        if (ferror(f)) {
            throw std::runtime_error(
                std::string("failure reading file ") + std::string(filename) + " into memory");
        }
        return result;
    }
}